

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_4::Validator::OnGlobalSetExpr(Validator *this,GlobalSetExpr *expr)

{
  Var local_70;
  Enum local_24;
  GlobalSetExpr *local_20;
  GlobalSetExpr *expr_local;
  Validator *this_local;
  
  local_20 = expr;
  expr_local = (GlobalSetExpr *)this;
  Var::Var(&local_70,&expr->var);
  local_24 = (Enum)SharedValidator::OnGlobalSet
                             (&this->validator_,
                              &(expr->super_ExprMixin<(wabt::ExprType)21>).super_Expr.loc,&local_70)
  ;
  Result::operator|=(&this->result_,(Result)local_24);
  Var::~Var(&local_70);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::OnGlobalSetExpr(GlobalSetExpr* expr) {
  result_ |= validator_.OnGlobalSet(expr->loc, expr->var);
  return Result::Ok;
}